

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void canvas_selectall(_glist *x)

{
  int iVar1;
  t_gobj *local_18;
  t_gobj *y;
  _glist *x_local;
  
  if (x->gl_editor != (t_editor *)0x0) {
    if ((*(ushort *)&x->field_0xe8 >> 5 & 1) == 0) {
      canvas_editmode(x,1.0);
    }
    iVar1 = glist_selectionindex(x,(t_gobj *)0x0,0);
    if (iVar1 == 0) {
      glist_noselect(x);
    }
    else {
      for (local_18 = x->gl_list; local_18 != (t_gobj *)0x0; local_18 = local_18->g_next) {
        iVar1 = glist_isselected(x,local_18);
        if (iVar1 == 0) {
          glist_select(x,local_18);
        }
      }
    }
  }
  return;
}

Assistant:

static void canvas_selectall(t_canvas *x)
{
    t_gobj *y;
    if (!x->gl_editor)
        return;
    if (!x->gl_edit)
        canvas_editmode(x, 1);
        /* if everyone is already selected deselect everyone */
    if (!glist_selectionindex(x, 0, 0))
        glist_noselect(x);
    else for (y = x->gl_list; y; y = y->g_next)
         {
             if (!glist_isselected(x, y))
                 glist_select(x, y);
         }
}